

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

float __thiscall V2LRC::step_2x(V2LRC *this,float in,float freq,float reso)

{
  float fVar1;
  float fVar2;
  
  fVar2 = this->b;
  fVar1 = freq * fVar2 + -3.8146973e-06 + this->l;
  fVar2 = (((in + 3.8146973e-06) - fVar2 * reso) - fVar1) * freq + fVar2;
  fVar1 = freq * fVar2 + fVar1;
  this->l = fVar1;
  fVar1 = ((in + 3.8146973e-06) - reso * fVar2) - fVar1;
  this->b = freq * fVar1 + fVar2;
  return fVar1;
}

Assistant:

float step_2x(float in, float freq, float reso)
    {
        // the filters get slightly biased inputs to avoid the state variables
        // getting too close to 0 for prolonged periods of time (which would
        // cause denormals to appear)
        in += fcdcoffset;

        // step 1
        l += freq * b - fcdcoffset; // undo bias here (1 sample delay)
        b += freq * (in - b*reso - l);

        // step 2
        l += freq * b;
        float h = in - b*reso - l;
        b += freq * h;

        return h;
    }